

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::
DoInitProperty_NoFastPath<Js::OpLayoutT_ElementPIndexed<Js::LayoutSizePolicy<(Js::LayoutSize)0>>const__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementPIndexed<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout,Var instance)

{
  byte bVar1;
  FunctionBody *functionBody;
  InlineCache *inlineCache;
  Var value;
  code *pcVar2;
  bool bVar3;
  PropertyId propertyId;
  undefined4 *puVar4;
  RecyclableObject *object;
  
  functionBody = *(FunctionBody **)(this + 0x88);
  bVar1 = playout->inlineCacheIndex;
  if (*(long *)(this + 0x90) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/InterpreterStackFrame.h"
                                ,0x378,"(this->inlineCaches != nullptr)",
                                "this->inlineCaches != nullptr");
    if (!bVar3) goto LAB_00a7bbfe;
    *puVar4 = 0;
  }
  if (*(uint *)(this + 200) <= (uint)bVar1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/InterpreterStackFrame.h"
                                ,0x379,"(cacheIndex < this->inlineCacheCount)",
                                "cacheIndex < this->inlineCacheCount");
    if (!bVar3) {
LAB_00a7bbfe:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  inlineCache = *(InlineCache **)(*(long *)(this + 0x90) + (ulong)bVar1 * 8);
  bVar1 = playout->inlineCacheIndex;
  object = VarTo<Js::RecyclableObject>(instance);
  propertyId = FunctionBody::GetPropertyIdFromCacheId
                         (*(FunctionBody **)(this + 0x88),(uint)playout->inlineCacheIndex);
  value = *(Var *)(this + (ulong)playout->Value * 8 + 0x160);
  ValidateRegValue(this,value,false,true);
  JavascriptOperators::PatchInitValue<false,Js::InlineCache>
            (functionBody,inlineCache,(uint)bVar1,object,propertyId,value);
  return;
}

Assistant:

_NOINLINE void InterpreterStackFrame::DoInitProperty_NoFastPath(unaligned T* playout, Var instance)
    {
        JavascriptOperators::PatchInitValue<false>(
            GetFunctionBody(),
            GetInlineCache(playout->inlineCacheIndex),
            playout->inlineCacheIndex,
            VarTo<RecyclableObject>(instance),
            GetPropertyIdFromCacheId(playout->inlineCacheIndex),
            GetReg(playout->Value));
    }